

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O1

spv_result_t spvtools::val::anon_unknown_1::LimitCheckSwitch(ValidationState_t *_,Instruction *inst)

{
  DiagnosticStream DStack_1f8;
  
  if (((inst->inst_).opcode == 0xfb) &&
     ((ulong)(_->options_->universal_limits_).max_switch_branches <
      ((long)(inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start >> 4) - 2U >> 1)) {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_BINARY,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&DStack_1f8,"Number of (literal, label) pairs in OpSwitch (",0x2e);
    std::ostream::_M_insert<unsigned_long>((ulong)&DStack_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&DStack_1f8,") exceeds the limit (",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&DStack_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,").",2);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  }
  else {
    DStack_1f8.error_ = SPV_SUCCESS;
  }
  return DStack_1f8.error_;
}

Assistant:

spv_result_t LimitCheckSwitch(ValidationState_t& _, const Instruction* inst) {
  if (spv::Op::OpSwitch == inst->opcode()) {
    // The instruction syntax is as follows:
    // OpSwitch <selector ID> <Default ID> literal label literal label ...
    // literal,label pairs come after the first 2 operands.
    // It is guaranteed at this point that num_operands is an even number.
    size_t num_pairs = (inst->operands().size() - 2) / 2;
    const unsigned int num_pairs_limit =
        _.options()->universal_limits_.max_switch_branches;
    if (num_pairs > num_pairs_limit) {
      return _.diag(SPV_ERROR_INVALID_BINARY, inst)
             << "Number of (literal, label) pairs in OpSwitch (" << num_pairs
             << ") exceeds the limit (" << num_pairs_limit << ").";
    }
  }
  return SPV_SUCCESS;
}